

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

QRectF * __thiscall
QPlainTextEditControl::blockBoundingRect
          (QRectF *__return_storage_ptr__,QPlainTextEditControl *this,QTextBlock *block)

{
  double dVar1;
  char cVar2;
  int iVar3;
  QObject *object;
  QPlainTextDocumentLayout *pQVar4;
  QWidget *pQVar5;
  int iVar6;
  long in_FS_OFFSET;
  double dVar7;
  undefined1 *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  qreal local_58;
  qreal qStack_50;
  undefined1 *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = this->topBlock;
  iVar3 = QTextBlock::blockNumber();
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  QWidgetTextControl::document((QWidgetTextControl *)this);
  QTextDocument::findBlockByNumber((int)&local_48);
  cVar2 = QTextBlock::isValid();
  if (cVar2 != '\0') {
    QWidgetTextControl::document((QWidgetTextControl *)this);
    object = (QObject *)QTextDocument::documentLayout();
    pQVar4 = QtPrivate::qobject_cast_helper<QPlainTextDocumentLayout*,QObject>(object);
    cVar2 = QTextBlock::isValid();
    if (cVar2 != '\0') {
      *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
      *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
      *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
      *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
      *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
      *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
      *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
      *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
      (**(code **)(*(long *)pQVar4 + 0x88))(__return_storage_ptr__,pQVar4,&local_48);
      dVar1 = __return_storage_ptr__->h;
      dVar7 = 0.0;
      while ((iVar6 < iVar3 &&
             (pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->textEdit),
             dVar7 - (double)(int)dVar1 <=
             (double)(((pQVar5->data->crect).y2.m_i - (pQVar5->data->crect).y1.m_i) * 2 + 2)))) {
        dVar7 = dVar7 + __return_storage_ptr__->h;
        QTextBlock::next();
        local_48 = local_68;
        uStack_40 = uStack_60;
        cVar2 = QTextBlock::isVisible();
        if (cVar2 == '\0') {
          QTextBlock::firstLineNumber();
          QTextDocument::findBlockByLineNumber((int)&local_68);
          local_48 = local_68;
          uStack_40 = uStack_60;
          iVar6 = QTextBlock::blockNumber();
        }
        else {
          iVar6 = iVar6 + 1;
        }
        (**(code **)(*(long *)pQVar4 + 0x88))(&local_68,pQVar4,&local_48);
        __return_storage_ptr__->w = local_58;
        __return_storage_ptr__->h = qStack_50;
        __return_storage_ptr__->xp = (qreal)local_68;
        __return_storage_ptr__->yp = (qreal)CONCAT44(uStack_5c,uStack_60);
      }
      for (; (iVar3 < iVar6 &&
             (pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->textEdit),
             (double)(~(pQVar5->data->crect).y2.m_i + (pQVar5->data->crect).y1.m_i) <=
             dVar7 + (double)(int)dVar1)); dVar7 = dVar7 - __return_storage_ptr__->h) {
        do {
          QTextBlock::previous();
          local_48 = local_68;
          uStack_40 = uStack_60;
          iVar6 = iVar6 + -1;
          cVar2 = QTextBlock::isVisible();
        } while (cVar2 == '\0');
        cVar2 = QTextBlock::isValid();
        if (cVar2 == '\0') break;
        (**(code **)(*(long *)pQVar4 + 0x88))(&local_68,pQVar4,&local_48);
        __return_storage_ptr__->w = local_58;
        __return_storage_ptr__->h = qStack_50;
        __return_storage_ptr__->xp = (qreal)local_68;
        __return_storage_ptr__->yp = (qreal)CONCAT44(uStack_5c,uStack_60);
      }
      if (iVar6 != iVar3) {
        (**(code **)(*(long *)pQVar4 + 0x88))(&local_68,pQVar4,block);
        __return_storage_ptr__->w = local_58;
        __return_storage_ptr__->h = qStack_50;
        __return_storage_ptr__->xp = (qreal)local_68;
        __return_storage_ptr__->yp = (qreal)CONCAT44(uStack_5c,uStack_60);
        if (iVar3 < iVar6) {
          dVar7 = dVar7 - __return_storage_ptr__->h;
        }
      }
      __return_storage_ptr__->xp = __return_storage_ptr__->xp + 0.0;
      __return_storage_ptr__->yp = dVar7 + __return_storage_ptr__->yp;
      goto LAB_00457ceb;
    }
  }
  __return_storage_ptr__->w = 0.0;
  __return_storage_ptr__->h = 0.0;
  __return_storage_ptr__->xp = 0.0;
  __return_storage_ptr__->yp = 0.0;
LAB_00457ceb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QPlainTextEditControl::blockBoundingRect(const QTextBlock &block) const {
    int currentBlockNumber = topBlock;
    int blockNumber = block.blockNumber();
    QTextBlock currentBlock = document()->findBlockByNumber(currentBlockNumber);
    if (!currentBlock.isValid())
        return QRectF();
    Q_ASSERT(currentBlock.blockNumber() == currentBlockNumber);
    QTextDocument *doc = document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(doc->documentLayout());
    Q_ASSERT(documentLayout);

    QPointF offset;
    if (!block.isValid())
        return QRectF();
    QRectF r = documentLayout->blockBoundingRect(currentBlock);
    int maxVerticalOffset = r.height();
    while (currentBlockNumber < blockNumber && offset.y() - maxVerticalOffset <= 2* textEdit->viewport()->height()) {
        offset.ry() += r.height();
        currentBlock = currentBlock.next();
        ++currentBlockNumber;
        if (!currentBlock.isVisible()) {
            currentBlock = doc->findBlockByLineNumber(currentBlock.firstLineNumber());
            currentBlockNumber = currentBlock.blockNumber();
        }
        r = documentLayout->blockBoundingRect(currentBlock);
    }
    while (currentBlockNumber > blockNumber && offset.y() + maxVerticalOffset >= -textEdit->viewport()->height()) {
        currentBlock = currentBlock.previous();
        --currentBlockNumber;
        while (!currentBlock.isVisible()) {
            currentBlock = currentBlock.previous();
            --currentBlockNumber;
        }
        if (!currentBlock.isValid())
            break;

        r = documentLayout->blockBoundingRect(currentBlock);
        offset.ry() -= r.height();
    }

    if (currentBlockNumber != blockNumber) {
        // fallback for blocks out of reach. Give it some geometry at
        // least, and ensure the layout is up to date.
        r = documentLayout->blockBoundingRect(block);
        if (currentBlockNumber > blockNumber)
            offset.ry() -= r.height();
    }
    r.translate(offset);
    return r;
}